

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object_history.cpp
# Opt level: O2

ON_GeometryValue * __thiscall
ON_GeometryValue::operator=(ON_GeometryValue *this,ON_GeometryValue *src)

{
  ON_SimpleArray<ON_Geometry_*> *this_00;
  uint uVar1;
  ON_Geometry **ppOVar2;
  ON_Geometry *pOVar3;
  ON_Geometry *in_RAX;
  ulong uVar4;
  ulong uVar5;
  ON_Geometry *ptr;
  ON_Geometry *local_38;
  
  if (this != src) {
    uVar1 = (this->m_value).m_count;
    uVar5 = 0;
    uVar4 = (ulong)uVar1;
    local_38 = in_RAX;
    if ((int)uVar1 < 1) {
      uVar4 = uVar5;
    }
    for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
      ppOVar2 = (this->m_value).m_a;
      pOVar3 = ppOVar2[uVar5];
      ppOVar2[uVar5] = (ON_Geometry *)0x0;
      if (pOVar3 != (ON_Geometry *)0x0) {
        (*(pOVar3->super_ON_Object)._vptr_ON_Object[4])();
      }
    }
    this_00 = &this->m_value;
    ON_SimpleArray<ON_Geometry_*>::Destroy(this_00);
    (this->super_ON_Value).m_value_id = (src->super_ON_Value).m_value_id;
    uVar1 = (src->m_value).m_count;
    ON_SimpleArray<ON_Geometry_*>::Reserve(this_00,(long)(int)uVar1);
    uVar5 = 0;
    uVar4 = 0;
    if (0 < (int)uVar1) {
      uVar4 = (ulong)uVar1;
    }
    for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
      pOVar3 = (src->m_value).m_a[uVar5];
      if ((pOVar3 != (ON_Geometry *)0x0) &&
         (local_38 = ON_Geometry::Duplicate(pOVar3), local_38 != (ON_Geometry *)0x0)) {
        ON_SimpleArray<ON_Geometry_*>::Append(this_00,&local_38);
      }
    }
  }
  return this;
}

Assistant:

ON_GeometryValue& ON_GeometryValue::operator=(const ON_GeometryValue& src)
{
  if ( this != &src )
  {
    int i, count = m_value.Count();
    for ( i = 0; i < count; i++ )
    {
      ON_Geometry* p = m_value[i];
      m_value[i] = 0;
      if (p)
      {
        delete p;
      }
    }
    m_value.Destroy();

    m_value_id = src.m_value_id;

    count = src.m_value.Count();
    m_value.Reserve(count);
    for ( i = 0; i < count; i++ )
    {
      const ON_Geometry* src_ptr = src.m_value[i];
      if ( !src_ptr )
        continue;
      ON_Geometry* ptr = src_ptr->Duplicate();
      if ( ptr )
        m_value.Append(ptr);
    }
  }
  return *this;
}